

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O3

void __thiscall TCPConnection::BuildPacket(TCPConnection *this,DataBuffer *buffer,uint8_t flags)

{
  ushort uVar1;
  ProtocolIPv4 *this_00;
  uint16_t value;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint64_t uVar4;
  uint8_t *puVar5;
  
  puVar3 = buffer->Packet;
  puVar5 = puVar3 + -0x14;
  buffer->Packet = puVar5;
  if (puVar3 != (uint8_t *)0x0) {
    uVar1 = buffer->Length;
    Pack16(puVar5,0,this->LocalPort);
    Pack16(puVar5,2,this->RemotePort);
    Pack32(puVar5,4,this->SequenceNumber);
    uVar2 = this->AcknowledgementNumber;
    if (0 < (int)(uVar2 - this->LastAck)) {
      this->LastAck = uVar2;
    }
    Pack32(puVar5,8,uVar2);
    puVar3[-8] = 'P';
    puVar3[-7] = flags | 0x10;
    Pack16(puVar5,0xe,this->CurrentWindow);
    Pack16(puVar5,0x10,0);
    Pack16(puVar5,0x12,0);
    uVar2 = this->SequenceNumber + (uint)uVar1;
    this->SequenceNumber = uVar2;
    buffer->AcknowledgementNumber = uVar2;
    if ((int)(this->MaxSequenceTx - uVar2) < 0) {
      do {
        puts("tx window full");
        osEvent::Wait(&this->Event,
                      "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                      ,0x7c,-1);
      } while ((int)(this->MaxSequenceTx - this->SequenceNumber) < 0);
    }
    puVar3 = ProtocolIPv4::GetUnicastAddress(this->IP);
    value = ProtocolTCP::ComputeChecksum(puVar5,uVar1 + 0x14,puVar3,this->RemoteAddress);
    Pack16(puVar5,0x10,value);
    buffer->Length = buffer->Length + 0x14;
    if ((flags & 3) != 0 || uVar1 != 0) {
      buffer->Disposable = false;
      uVar4 = osTime::GetTime();
      buffer->Time_us = (uint32_t)uVar4;
      osMutex::Take(&this->HoldingQueueLock,
                    "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                    ,0x8a);
      osQueue::Put(&this->HoldingQueue,buffer);
      osMutex::Give(&this->HoldingQueueLock);
    }
    this_00 = this->IP;
    puVar5 = ProtocolIPv4::GetUnicastAddress(this_00);
    ProtocolIPv4::Transmit(this_00,buffer,'\x06',this->RemoteAddress,puVar5);
    return;
  }
  return;
}

Assistant:

void TCPConnection::BuildPacket(DataBuffer* buffer, uint8_t flags)
{
    uint8_t* packet;
    uint16_t checksum;
    uint16_t length;

    flags |= FLAG_ACK;

    buffer->Packet -= ProtocolTCP::header_size();
    packet = buffer->Packet;
    length = buffer->Length;
    if (packet != nullptr)
    {
        Pack16(packet, 0, LocalPort);
        Pack16(packet, 2, RemotePort);
        Pack32(packet, 4, SequenceNumber);
        if ((int32_t)(AcknowledgementNumber - LastAck) > 0)
        {
            // Only advance LastAck if Ack > LastAck
            LastAck = AcknowledgementNumber;
        }
        Pack32(packet, 8, AcknowledgementNumber);
        packet[12] = 0x50; // Header length and reserved
        packet[13] = flags;
        Pack16(packet, 14, CurrentWindow);
        Pack16(packet, 16, 0); // checksum placeholder
        Pack16(packet, 18, 0); // urgent pointer

        SequenceNumber += length;
        buffer->AcknowledgementNumber = SequenceNumber;

        while ((int32_t)(MaxSequenceTx - SequenceNumber) < 0)
        {
            printf("tx window full\n");
            Event.Wait(__FILE__, __LINE__);
        }

        checksum = ProtocolTCP::ComputeChecksum(
            packet, length + ProtocolTCP::header_size(), IP->GetUnicastAddress(), RemoteAddress);

        Pack16(packet, 16, checksum); // checksum

        buffer->Length += ProtocolTCP::header_size();

        if (length > 0 || (flags & (FLAG_SYN | FLAG_FIN)))
        {
            buffer->Disposable = false;
            buffer->Time_us = (uint32_t)osTime::GetTime();
            HoldingQueueLock.Take(__FILE__, __LINE__);
            HoldingQueue.Put(buffer);
            HoldingQueueLock.Give();
        }

        IP->Transmit(buffer, 0x06, RemoteAddress, IP->GetUnicastAddress());
    }
}